

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::StringBracketHelper
              (Arguments *args,ScriptContext *scriptContext,char16 *pszTag,charcount_t cchTag,
              char16 *pszProp,charcount_t cchProp)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  char16_t cVar4;
  BOOL BVar5;
  uint32 uVar6;
  Var pvVar7;
  JavascriptString *pJVar8;
  char16 *pcVar9;
  ulong uVar10;
  char16 *pcVar11;
  undefined4 *puVar12;
  char16 *pcVar13;
  long lVar14;
  ulong count;
  char16 *pcVar15;
  ulong uVar16;
  long lVar17;
  uint rhs;
  uint uVar18;
  long lVar19;
  size_t sVar20;
  char16 local_a8 [4];
  char16 quotStr [7];
  BufferStringBuilder local_58;
  BufferStringBuilder builder;
  uint local_34;
  
  quotStr[0] = L't';
  quotStr[1] = L';';
  quotStr[2] = L'\0';
  builtin_memcpy(local_a8,L"&quo",8);
  builder.m_string._4_4_ = cchProp;
  if (((ulong)args->Info & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec73,(PCWSTR)0x0);
  }
  bVar3 = ((scriptContext->config).threadConfig)->m_ES6StringPrototypeFixes;
  if (bVar3 != false) {
    pvVar7 = Arguments::operator[](args,0);
    BVar5 = JavascriptConversion::CheckObjectCoercible(pvVar7,scriptContext);
    if (BVar5 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,pszTag);
    }
  }
  pvVar7 = Arguments::operator[](args,0);
  bVar2 = VarIs<Js::JavascriptString>(pvVar7);
  if ((!bVar2) ||
     (register0x00000000 = UnsafeVarTo<Js::JavascriptString>(pvVar7),
     register0x00000000 == (JavascriptString *)0x0)) {
    pvVar7 = Arguments::operator[](args,0);
    register0x00000000 = JavascriptConversion::ToString(pvVar7,scriptContext);
  }
  uVar18 = register0x00000000->m_charLength;
  count = (ulong)uVar18;
  uVar6 = UInt32Math::Add(cchTag,cchTag);
  uVar6 = UInt32Math::Add(uVar6,5);
  if (pszProp == (char16 *)0x0) {
    pcVar9 = (char16 *)0x0;
    local_34 = 0;
    uVar16 = 0;
    builder.m_string._4_4_ = 0;
  }
  else {
    if (((ulong)args->Info & 0xfffffe) == 0) {
      pJVar8 = StringCache::GetUndefinedDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
    }
    else {
      pvVar7 = Arguments::operator[](args,1);
      bVar2 = VarIs<Js::JavascriptString>(pvVar7);
      if ((!bVar2) ||
         (pJVar8 = UnsafeVarTo<Js::JavascriptString>(pvVar7), pJVar8 == (JavascriptString *)0x0)) {
        pvVar7 = Arguments::operator[](args,1);
        pJVar8 = JavascriptConversion::ToString(pvVar7,scriptContext);
      }
    }
    uVar16 = (ulong)pJVar8->m_charLength;
    pcVar9 = GetString(pJVar8);
    local_34 = 0;
    if (bVar3 != false) {
      local_34 = 0;
      for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
        local_34 = local_34 + (pcVar9[uVar10] == L'\"');
      }
    }
    uVar6 = UInt32Math::Add(uVar6,builder.m_string._4_4_);
    uVar6 = UInt32Math::Add(uVar6,4);
    if (bVar3 != false) {
      if ((int)((ulong)local_34 * 6 >> 0x20) != 0) {
        ::Math::DefaultOverflowPolicy();
      }
      uVar6 = UInt32Math::Add(uVar6,(uint32)((ulong)local_34 * 6));
      uVar6 = uVar6 - local_34;
    }
  }
  uVar6 = UInt32Math::Add(uVar6,uVar18);
  rhs = (uint)uVar16;
  uVar6 = UInt32Math::Add(uVar6,rhs);
  if (((uVar6 < rhs) || (0x7ffffffe < uVar6)) || (uVar6 < uVar18)) {
    JavascriptError::ThrowOutOfMemoryError(scriptContext);
  }
  local_58.m_string = BufferStringBuilder::WritableString::New(uVar6,scriptContext);
  pcVar11 = BufferStringBuilder::DangerousGetWritableBuffer(&local_58);
  *pcVar11 = L'<';
  for (lVar19 = 0; (ulong)cchTag * 2 != lVar19; lVar19 = lVar19 + 2) {
    cVar4 = *(char16_t *)((long)pszTag + lVar19);
    if (bVar3 == false) {
      cVar4 = PAL_towupper(cVar4);
    }
    *(char16_t *)((long)pcVar11 + lVar19 + 2) = cVar4;
  }
  pcVar15 = (char16 *)((long)pcVar11 + lVar19 + 2);
  if (pszProp != (char16 *)0x0) {
    lVar14 = (-8 - (long)pcVar11) - lVar19;
    *pcVar15 = L' ';
    uVar10 = (ulong)builder.m_string._4_4_;
    for (lVar17 = 0; uVar10 * 2 != lVar17; lVar17 = lVar17 + 2) {
      cVar4 = *(char16_t *)((long)pszProp + lVar17);
      if (bVar3 == false) {
        cVar4 = PAL_towupper(cVar4);
      }
      *(char16_t *)((long)pcVar11 + lVar19 + lVar17 + 4) = cVar4;
      lVar14 = lVar14 + -2;
    }
    *(undefined4 *)((long)pcVar11 + lVar19 + 4 + lVar17) = 0x22003d;
    if (pcVar9 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xd28,"(propertyValueStr != nullptr)",
                                  "propertyValueStr != nullptr");
      if (!bVar2) goto LAB_00bc3d59;
      *puVar12 = 0;
    }
    pcVar15 = (char16 *)((long)pcVar11 + lVar17 + lVar19 + 8);
    if ((bVar3 == false) || (local_34 == 0)) {
      pcVar13 = BufferStringBuilder::DangerousGetWritableBuffer(&local_58);
      js_wmemcpy_s(pcVar15,~(-(lVar14 + (long)pcVar13) >> 1) + (ulong)uVar6,pcVar9,uVar16);
      pcVar15 = (char16 *)((long)pcVar11 + lVar17 + lVar19 + uVar16 * 2 + 8);
    }
    else {
      for (sVar20 = 0; uVar16 != sVar20; sVar20 = sVar20 + 1) {
        if (pcVar9[sVar20] == L'\"') {
          pcVar11 = BufferStringBuilder::DangerousGetWritableBuffer(&local_58);
          uVar18 = ~(uint)((ulong)((long)pcVar15 - (long)pcVar11) >> 1) + uVar6;
          js_wmemcpy_s(pcVar15,(ulong)uVar18,local_a8,6);
          pcVar15 = pcVar15 + 6;
          local_34 = local_34 - 1;
          if (local_34 == 0) {
            uVar16 = (ulong)(~(uint)sVar20 + rhs);
            js_wmemcpy_s(pcVar15,(ulong)(uVar18 - 6),pcVar9 + ((uint)sVar20 + 1),uVar16);
            pcVar15 = pcVar15 + uVar16;
            break;
          }
        }
        else {
          *pcVar15 = pcVar9[sVar20];
          pcVar15 = pcVar15 + 1;
        }
      }
    }
    *pcVar15 = L'\"';
    pcVar15 = pcVar15 + 1;
  }
  *pcVar15 = L'>';
  pcVar9 = GetString(stack0xffffffffffffff68);
  pcVar11 = BufferStringBuilder::DangerousGetWritableBuffer(&local_58);
  js_wmemcpy_s(pcVar15 + 1,~((long)(pcVar15 + 1) - (long)pcVar11 >> 1) + (ulong)uVar6,pcVar9,count);
  (pcVar15 + count + 1)[0] = L'<';
  (pcVar15 + count + 1)[1] = L'/';
  lVar19 = -8 - (long)(pcVar15 + count);
  for (uVar16 = 0; cchTag != uVar16; uVar16 = uVar16 + 1) {
    cVar4 = pszTag[uVar16];
    if (bVar3 == false) {
      cVar4 = PAL_towupper(cVar4);
    }
    pcVar15[count + uVar16 + 3] = cVar4;
    lVar19 = lVar19 + -2;
  }
  pcVar15[count + uVar16 + 3] = L'>';
  pcVar9 = BufferStringBuilder::DangerousGetWritableBuffer(&local_58);
  if (uVar6 != (uint32)((ulong)-((long)pcVar9 + lVar19) >> 1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xd71,
                                "((charcount_t)(pResult - builder.DangerousGetWritableBuffer()) == cchTotalChars)"
                                ,"Exceeded allocated string limit");
    if (!bVar3) {
LAB_00bc3d59:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar12 = 0;
  }
  pJVar8 = BufferStringBuilder::ToString(&local_58);
  return pJVar8;
}

Assistant:

Var JavascriptString::StringBracketHelper(Arguments args, ScriptContext *scriptContext, __in_ecount(cchTag) char16 const *pszTag,
                                                charcount_t cchTag, __in_ecount_opt(cchProp) char16 const *pszProp, charcount_t cchProp)
    {
        charcount_t cchThis;
        charcount_t cchPropertyValue;
        charcount_t cchTotalChars;
        charcount_t ich;
        JavascriptString * pThis = nullptr;
        JavascriptString * pPropertyValue = nullptr;
        const char16 * propertyValueStr = nullptr;
        uint quotesCount = 0;
        const char16 quotStr[] = _u("&quot;");
        const charcount_t quotStrLen = _countof(quotStr) - 1;
        bool ES6FixesEnabled = scriptContext->GetConfig()->IsES6StringPrototypeFixEnabled();

        // Assemble the component pieces of a string tag function (ex: String.prototype.link).
        // In the general case, result is as below:
        //
        // pszProp = _u("href");
        // pszTag = _u("a");
        // pThis = VarTo<JavascriptString>(args[0]);
        // pPropertyValue = VarTo<JavascriptString>(args[1]);
        //
        // pResult = _u("<a href=\"[[pPropertyValue]]\">[[pThis]]</a>");
        //
        // cchTotalChars = 5                    // <></>
        //                 + cchTag * 2         // a
        //                 + cchProp            // href
        //                 + 4                  // _=""
        //                 + cchPropertyValue
        //                 + cchThis;
        //
        // Note: With ES6FixesEnabled, we need to escape quote characters (_u('"')) in pPropertyValue.
        // Note: Without ES6FixesEnabled, the tag and prop strings should be capitalized.

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedString);
        }

        if (ES6FixesEnabled)
        {
            if (!JavascriptConversion::CheckObjectCoercible(args[0], scriptContext))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, pszTag);
            }
        }

        pThis = JavascriptOperators::TryFromVar<JavascriptString>(args[0]);
        if (!pThis)
        {
            pThis = JavascriptConversion::ToString(args[0], scriptContext);
        }

        cchThis = pThis->GetLength();
        cchTotalChars = UInt32Math::Add(cchTag, cchTag);

        // 5 is for the <></> characters
        cchTotalChars = UInt32Math::Add(cchTotalChars, 5);

        if (nullptr != pszProp)
        {
            // Need one string argument.
            if (args.Info.Count >= 2)
            {
                pPropertyValue = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
                if (!pPropertyValue)
                {
                    pPropertyValue = JavascriptConversion::ToString(args[1], scriptContext);
                }
            }
            else
            {
                pPropertyValue = scriptContext->GetLibrary()->GetUndefinedDisplayString();
            }

            cchPropertyValue = pPropertyValue->GetLength();
            propertyValueStr = pPropertyValue->GetString();

            if (ES6FixesEnabled)
            {
                // Count the number of " characters we need to escape.
                for (ich = 0; ich < cchPropertyValue; ich++)
                {
                    if (propertyValueStr[ich] == _u('"'))
                    {
                        ++quotesCount;
                    }
                }
            }

            cchTotalChars = UInt32Math::Add(cchTotalChars, cchProp);

            // 4 is for the _="" characters
            cchTotalChars = UInt32Math::Add(cchTotalChars, 4);

            if (ES6FixesEnabled)
            {
                // Account for the " escaping (&quot;)
                cchTotalChars = UInt32Math::Add(cchTotalChars, UInt32Math::Mul(quotesCount, quotStrLen)) - quotesCount;
            }
        }
        else
        {
            cchPropertyValue = 0;
            cchProp = 0;
        }
        cchTotalChars = UInt32Math::Add(cchTotalChars, cchThis);
        cchTotalChars = UInt32Math::Add(cchTotalChars, cchPropertyValue);
        if (!IsValidCharCount(cchTotalChars) || cchTotalChars < cchThis || cchTotalChars < cchPropertyValue)
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        BufferStringBuilder builder(cchTotalChars, scriptContext);
        char16 *pResult = builder.DangerousGetWritableBuffer();

        *pResult++ = _u('<');
        for (ich = 0; ich < cchTag; ich++)
        {
            *pResult++ = ES6FixesEnabled ? pszTag[ich] : towupper(pszTag[ich]);
        }
        if (nullptr != pszProp)
        {
            *pResult++ = _u(' ');
            for (ich = 0; ich < cchProp; ich++)
            {
                *pResult++ = ES6FixesEnabled ? pszProp[ich] : towupper(pszProp[ich]);
            }
            *pResult++ = _u('=');
            *pResult++ = _u('"');

            Assert(propertyValueStr != nullptr);

            if (!ES6FixesEnabled || quotesCount == 0)
            {
                js_wmemcpy_s(pResult,
                    cchTotalChars - (pResult - builder.DangerousGetWritableBuffer() + 1),
                    propertyValueStr,
                    cchPropertyValue);

                pResult += cchPropertyValue;
            }
            else {
                for (ich = 0; ich < cchPropertyValue; ich++)
                {
                    if (propertyValueStr[ich] == _u('"'))
                    {
                        charcount_t destLengthLeft = (cchTotalChars - (charcount_t)(pResult - builder.DangerousGetWritableBuffer() + 1));

                        // Copy the quote string into result beginning at the index where the quote would appear
                        js_wmemcpy_s(pResult,
                            destLengthLeft,
                            quotStr,
                            quotStrLen);

                        // Move result ahead by the length of the quote string
                        pResult += quotStrLen;
                        // We ate one of the quotes
                        quotesCount--;

                        // We only need to check to see if we have no more quotes after eating a quote
                        if (quotesCount == 0)
                        {
                            // Skip the quote character.
                            // Note: If ich is currently the last character (cchPropertyValue-1), it becomes cchPropertyValue after incrementing.
                            // At that point, cchPropertyValue - ich == 0 so we will not increment pResult and will call memcpy for zero bytes.
                            ich++;

                            // Copy the rest from the property value string starting at the index after the last quote
                            js_wmemcpy_s(pResult,
                                destLengthLeft - quotStrLen,
                                propertyValueStr + ich,
                                cchPropertyValue - ich);

                            // Move result ahead by the length of the rest of the property string
                            pResult += (cchPropertyValue - ich);
                            break;
                        }
                    }
                    else
                    {
                        // Each non-quote character just gets copied into result string
                        *pResult++ = propertyValueStr[ich];
                    }
                }
            }

            *pResult++ = _u('"');
        }
        *pResult++ = _u('>');

        const char16 *pThisString = pThis->GetString();
        js_wmemcpy_s(pResult, cchTotalChars - (pResult - builder.DangerousGetWritableBuffer() + 1), pThisString, cchThis);
        pResult += cchThis;

        *pResult++ = _u('<');
        *pResult++ = _u('/');
        for (ich = 0; ich < cchTag; ich++)
        {
            *pResult++ = ES6FixesEnabled ? pszTag[ich] : towupper(pszTag[ich]);
        }
        *pResult++ = _u('>');

        // Assert we ended at the right place.
        AssertMsg((charcount_t)(pResult - builder.DangerousGetWritableBuffer()) == cchTotalChars, "Exceeded allocated string limit");

        return builder.ToString();
    }